

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stagewise_poly.cc
# Opt level: O2

uint64_t wid_mask_un_shifted(stagewise_poly *poly,uint64_t wid)

{
  vw *pvVar1;
  uint64_t *puVar2;
  uint32_t *puVar3;
  
  pvVar1 = poly->all;
  puVar3 = &(pvVar1->weights).dense_weights._stride_shift;
  puVar2 = &(pvVar1->weights).dense_weights._weight_mask;
  if ((pvVar1->weights).sparse != false) {
    puVar3 = &(pvVar1->weights).sparse_weights._stride_shift;
    puVar2 = &(pvVar1->weights).sparse_weights._weight_mask;
  }
  return (wid & *puVar2) >> ((byte)*puVar3 & 0x3f);
}

Assistant:

inline uint64_t wid_mask_un_shifted(const stagewise_poly &poly, uint64_t wid)
{
  return stride_un_shift(poly, wid & poly.all->weights.mask());
}